

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

void __thiscall
LASquadtree::raster_occupancy
          (LASquadtree *this,_func_BOOL_I32 *does_cell_exist,U32 *data,U32 min_x,U32 min_y,
          U32 level_index,U32 level,U32 stop_level)

{
  U32 min_x_00;
  char cVar1;
  BOOL BVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  U32 level_00;
  
  uVar7 = (ulong)level;
  uVar5 = uVar7;
  if (level <= stop_level && stop_level - level != 0) {
    uVar5 = (ulong)stop_level;
  }
  iVar10 = level * 2;
  cVar6 = -1;
  lVar8 = 0;
  while( true ) {
    if (this->sub_level == 0) {
      uVar9 = this->level_offset[uVar7 + lVar8] + level_index;
    }
    else {
      uVar9 = (this->sub_level_index << ((byte)iVar10 & 0x1f)) + level_index +
              this->level_offset[this->sub_level + level + (int)lVar8];
    }
    cVar1 = (char)(stop_level - level);
    bVar4 = (byte)stop_level;
    if ((this->adaptive[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) == 0) break;
    if (uVar5 - uVar7 == lVar8) {
      iVar10 = 1 << (bVar4 - (char)uVar5 & 0x1f);
      uVar9 = iVar10 + min_y;
      if (min_y < uVar9) {
        do {
          uVar3 = (min_y << (bVar4 & 0x1f)) + min_x;
          iVar11 = iVar10;
          do {
            data[uVar3 >> 5] = data[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
            uVar3 = uVar3 + 1;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
          min_y = min_y + 1;
        } while (min_y != uVar9);
      }
      return;
    }
    level_00 = level + (int)lVar8 + 1;
    iVar11 = 1 << (cVar1 + cVar6 & 0x1fU);
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,level_index * 4,level_00,stop_level);
    min_x_00 = iVar11 + min_x;
    raster_occupancy(this,does_cell_exist,data,min_x_00,min_y,level_index * 4 + 1,level_00,
                     stop_level);
    min_y = iVar11 + min_y;
    raster_occupancy(this,does_cell_exist,data,min_x,min_y,level_index * 4 + 2,level_00,stop_level);
    level_index = level_index * 4 + 3;
    lVar8 = lVar8 + 1;
    iVar10 = iVar10 + 2;
    cVar6 = cVar6 + -1;
    min_x = min_x_00;
  }
  BVar2 = (*does_cell_exist)(uVar9);
  if (!BVar2) {
    return;
  }
  iVar10 = 1 << (cVar1 - (char)lVar8 & 0x1fU);
  uVar9 = iVar10 + min_y;
  if (uVar9 <= min_y) {
    return;
  }
  do {
    uVar3 = (min_y << (bVar4 & 0x1f)) + min_x;
    iVar11 = iVar10;
    do {
      data[uVar3 >> 5] = data[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + 1;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    min_y = min_y + 1;
  } while (min_y != uVar9);
  return;
}

Assistant:

void LASquadtree::raster_occupancy(BOOL(*does_cell_exist)(I32), U32* data, U32 min_x, U32 min_y, U32 level_index, U32 level, U32 stop_level) const
{
  U32 cell_index = get_cell_index(level_index, level);
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  // have we reached a leaf
  if (adaptive[adaptive_pos] & adaptive_bit) // interior node
  {
    if (level < stop_level) // do we need to continue
    {
      level_index <<= 2;
      level += 1;
      U32 size = 1 << (stop_level-level);
      // recurse into the four children
      raster_occupancy(does_cell_exist, data, min_x, min_y, level_index, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y, level_index + 1, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x, min_y+size, level_index + 2, level, stop_level);
      raster_occupancy(does_cell_exist, data, min_x+size, min_y+size, level_index + 3, level, stop_level);
      return;
    }
    else // no ... raster remaining subtree
    {
      U32 full_size = (1 << stop_level);
      U32 size = 1 << (stop_level-level);
      U32 max_y = min_y + size;
      U32 pos, pos_x, pos_y;
      for (pos_y = min_y; pos_y < max_y; pos_y++)
      {
        pos = pos_y*full_size + min_x;
        for (pos_x = 0; pos_x < size; pos_x++)
        {
          data[pos/32] |= (1<<(pos%32));
          pos++;
        }
      }
    }
  }
  else if (does_cell_exist(cell_index))
  {
    // raster actual cell
    U32 full_size = (1 << stop_level);
    U32 size = 1 << (stop_level-level);
    U32 max_y = min_y + size;
    U32 pos, pos_x, pos_y;
    for (pos_y = min_y; pos_y < max_y; pos_y++)
    {
      pos = pos_y*full_size + min_x;
      for (pos_x = 0; pos_x < size; pos_x++)
      {
        data[pos/32] |= (1<<(pos%32));
        pos++;
      }
    }
  }
}